

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O2

string * __thiscall
adios2::format::DataManSerializer::GetDestination_abi_cxx11_
          (string *__return_storage_ptr__,DataManSerializer *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_Destination);
  return __return_storage_ptr__;
}

Assistant:

std::string DataManSerializer::GetDestination() { return m_Destination; }